

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_leaflist(lyout *out,int level,lys_node *node)

{
  char *__s2;
  ly_ctx *ctx;
  int level_00;
  int iVar1;
  char *pcVar2;
  lys_module *plVar3;
  char *pcVar4;
  char *local_38;
  char *dflt;
  lys_node_leaflist *llist;
  int i;
  lys_node *node_local;
  int level_local;
  lyout *out_local;
  
  yin_print_open(out,level,(char *)0x0,"leaf-list","name",node->name,1);
  level_00 = level + 1;
  yin_print_snode_common(out,level_00,node,node->module,(int *)0x0,1);
  if (node[1].name != (char *)0x0) {
    yin_print_when(out,level_00,node->module,(lys_when *)node[1].name);
  }
  for (llist._4_4_ = 0; llist._4_4_ < (int)(uint)node->iffeature_size; llist._4_4_ = llist._4_4_ + 1
      ) {
    yin_print_iffeature(out,level_00,node->module,node->iffeature + llist._4_4_);
  }
  yin_print_type(out,level_00,node->module,(lys_type *)&node[1].ref);
  yin_print_substmt(out,level_00,LYEXT_SUBSTMT_UNITS,'\0',(char *)node[1].next,node->module,
                    node->ext,(uint)node->ext_size);
  for (llist._4_4_ = 0; llist._4_4_ < (int)(uint)node->padding[3]; llist._4_4_ = llist._4_4_ + 1) {
    yin_print_must(out,level_00,node->module,(lys_restr *)(node[1].dsc + (long)llist._4_4_ * 0x38));
  }
  llist._4_4_ = 0;
  do {
    if ((int)(uint)node->padding[2] <= llist._4_4_) {
      yin_print_snode_common(out,level_00,node,node->module,(int *)0x0,4);
      if (*(int *)&node[1].priv != 0) {
        yin_print_unsigned(out,level_00,LYEXT_SUBSTMT_MIN,'\0',node->module,node->ext,
                           (uint)node->ext_size,*(uint *)&node[1].priv);
      }
      if (*(int *)((long)&node[1].priv + 4) != 0) {
        yin_print_unsigned(out,level_00,LYEXT_SUBSTMT_MAX,'\0',node->module,node->ext,
                           (uint)node->ext_size,*(uint *)((long)&node[1].priv + 4));
      }
      if ((node->flags & 0x100) == 0) {
        iVar1 = lys_ext_iter(node->ext,node->ext_size,'\0',LYEXT_SUBSTMT_ORDEREDBY);
        if (iVar1 != -1) {
          yin_print_substmt(out,level_00,LYEXT_SUBSTMT_ORDEREDBY,'\0',"system",node->module,
                            node->ext,(uint)node->ext_size);
        }
      }
      else {
        yin_print_substmt(out,level_00,LYEXT_SUBSTMT_ORDEREDBY,'\0',"user",node->module,node->ext,
                          (uint)node->ext_size);
      }
      yin_print_snode_common(out,level_00,node,node->module,(int *)0x0,0x70);
      yin_print_close(out,level,(char *)0x0,"leaf-list",1);
      return;
    }
    if ((node->flags & 0x1000) == 0) {
      local_38 = *(char **)((node[1].prev)->padding + (long)llist._4_4_ * 8 + -0x1c);
    }
    else {
      pcVar2 = strchr(*(char **)((node[1].prev)->padding + (long)llist._4_4_ * 8 + -0x1c),0x3a);
      if (pcVar2 == (char *)0x0) {
        __assert_fail("strchr(llist->dflt[i], \':\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_yin.c"
                      ,0x4b3,"void yin_print_leaflist(struct lyout *, int, const struct lys_node *)"
                     );
      }
      pcVar2 = *(char **)((node[1].prev)->padding + (long)llist._4_4_ * 8 + -0x1c);
      plVar3 = lys_node_module(node);
      __s2 = plVar3->name;
      pcVar4 = strchr(*(char **)((node[1].prev)->padding + (long)llist._4_4_ * 8 + -0x1c),0x3a);
      iVar1 = strncmp(pcVar2,__s2,
                      (long)pcVar4 -
                      *(long *)((node[1].prev)->padding + (long)llist._4_4_ * 8 + -0x1c));
      if (iVar1 == 0) {
        ctx = node->module->ctx;
        pcVar2 = strchr(*(char **)((node[1].prev)->padding + (long)llist._4_4_ * 8 + -0x1c),0x3a);
        local_38 = lydict_insert(ctx,pcVar2 + 1,0);
      }
      else {
        local_38 = transform_json2schema
                             (node->module,
                              *(char **)((node[1].prev)->padding + (long)llist._4_4_ * 8 + -0x1c));
      }
    }
    yin_print_substmt(out,level_00,LYEXT_SUBSTMT_DEFAULT,(uint8_t)llist._4_4_,local_38,node->module,
                      node->ext,(uint)node->ext_size);
    if ((node->flags & 0x1000) != 0) {
      lydict_remove(node->module->ctx,local_38);
    }
    llist._4_4_ = llist._4_4_ + 1;
  } while( true );
}

Assistant:

static void
yin_print_leaflist(struct lyout *out, int level, const struct lys_node *node)
{
    int i;
    struct lys_node_leaflist *llist = (struct lys_node_leaflist *)node;
    const char *dflt;

    yin_print_open(out, level, NULL, "leaf-list", "name", node->name, 1);
    level++;

    yin_print_snode_common(out, level, node, node->module, NULL, SNODE_COMMON_EXT);
    if (llist->when) {
        yin_print_when(out, level, llist->module, llist->when);
    }
    for (i = 0; i < llist->iffeature_size; i++) {
        yin_print_iffeature(out, level, node->module, &llist->iffeature[i]);
    }
    yin_print_type(out, level, node->module, &llist->type);
    yin_print_substmt(out, level, LYEXT_SUBSTMT_UNITS, 0, llist->units,
                      node->module, node->ext, node->ext_size);
    for (i = 0; i < llist->must_size; i++) {
        yin_print_must(out, level, node->module, &llist->must[i]);
    }
    for (i = 0; i < llist->dflt_size; i++) {
        if (llist->flags & LYS_DFLTJSON) {
            assert(strchr(llist->dflt[i], ':'));
            if (!strncmp(llist->dflt[i], lys_node_module(node)->name, strchr(llist->dflt[i], ':') - llist->dflt[i])) {
                /* local module */
                dflt = lydict_insert(node->module->ctx, strchr(llist->dflt[i], ':') + 1, 0);
            } else {
                dflt = transform_json2schema(node->module, llist->dflt[i]);
            }
        } else {
            dflt = llist->dflt[i];
        }
        yin_print_substmt(out, level, LYEXT_SUBSTMT_DEFAULT, i, dflt,
                          node->module, node->ext, node->ext_size);
        if (llist->flags & LYS_DFLTJSON) {
            lydict_remove(node->module->ctx, dflt);
        }
    }
    yin_print_snode_common(out, level, node, node->module, NULL, SNODE_COMMON_CONFIG);
    if (llist->min > 0) {
        yin_print_unsigned(out, level, LYEXT_SUBSTMT_MIN, 0, node->module, node->ext, node->ext_size, llist->min);
    }
    if (llist->max > 0) {
        yin_print_unsigned(out, level, LYEXT_SUBSTMT_MAX, 0, node->module, node->ext, node->ext_size, llist->max);
    }
    if (llist->flags & LYS_USERORDERED) {
        yin_print_substmt(out, level, LYEXT_SUBSTMT_ORDEREDBY, 0, "user",
                          node->module, node->ext, node->ext_size);
    } else if (lys_ext_iter(node->ext, node->ext_size, 0, LYEXT_SUBSTMT_ORDEREDBY) != -1) {
        yin_print_substmt(out, level, LYEXT_SUBSTMT_ORDEREDBY, 0, "system",
                          node->module, node->ext, node->ext_size);
    }
    yin_print_snode_common(out, level, node, node->module, NULL,
                           SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);

    level--;
    yin_print_close(out, level, NULL, "leaf-list", 1);
}